

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O0

void __thiscall
singleParticleSpectra::output_three_particle_correlation_rap(singleParticleSpectra *this)

{
  _Setw _Var1;
  _Setprecision _Var2;
  ostream *poVar3;
  char *pcVar4;
  reference pvVar5;
  reference pvVar6;
  string *in_RDI;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double Cnmk_os_err;
  double Cnmk_os_stdsq;
  double Cnmk_os_avg;
  double Cnmk_ss_err;
  double Cnmk_ss_stdsq;
  double Cnmk_ss_avg;
  int i_1;
  double num_pair_os2_err;
  double num_pair_os2_stdsq;
  double num_pair_os2;
  double num_pair_ss2_err;
  double num_pair_ss2_stdsq;
  double num_pair_ss2;
  double num_pair_os_err;
  double num_pair_os_stdsq;
  double num_pair_os;
  double num_pair_ss_err;
  double num_pair_ss_stdsq;
  double num_pair_ss;
  double eta_local_1;
  int j_1;
  ofstream output_os2;
  ofstream output_ss2;
  ofstream output_os1;
  ofstream output_ss1;
  ostringstream filename_os2;
  ostringstream filename_os1;
  ostringstream filename_ss2;
  ostringstream filename_ss1;
  double Cnmk_err;
  double Cnmk_stdsq;
  double Cnmk_avg;
  int i;
  double num_pair_2_stdsq;
  double num_pair_2;
  double num_pair_err;
  double num_pair_stdsq;
  double num_pair;
  double eta_local;
  int j;
  ofstream output2;
  ofstream output1;
  ostringstream filename2;
  ostringstream filename1;
  double local_16f0;
  double local_16d0;
  int local_16b4;
  double local_16a8;
  double local_1688;
  double local_1668;
  double local_1648;
  int local_1624;
  string local_1620 [32];
  ostream local_1600 [512];
  string local_1400 [32];
  ostream local_13e0 [512];
  string local_11e0 [32];
  ostream local_11c0 [512];
  string local_fc0 [32];
  ostream local_fa0 [512];
  ostringstream local_da0 [376];
  ostringstream local_c28 [376];
  ostringstream local_ab0 [376];
  ostringstream local_938 [376];
  int local_7c0;
  int local_7bc;
  int local_7b8;
  int local_7b4;
  double local_7b0;
  double local_7a8;
  double local_7a0;
  int local_794;
  int local_790;
  int local_78c;
  double local_788;
  double local_780;
  int local_778;
  int local_774;
  double local_770;
  double local_768;
  double local_760;
  double local_758;
  int local_74c;
  string local_748 [32];
  ostream local_728 [512];
  string local_528 [32];
  ostream local_508 [528];
  ostringstream local_2f8 [376];
  ostringstream local_180 [384];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  std::__cxx11::ostringstream::ostringstream(local_2f8);
  poVar3 = std::operator<<((ostream *)local_180,in_RDI);
  poVar3 = std::operator<<(poVar3,"/particle_");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x1b8));
  poVar3 = std::operator<<(poVar3,"_Cmnk_eta12");
  poVar3 = std::operator<<(poVar3,"_pT_");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x2b8));
  poVar3 = std::operator<<(poVar3,"_");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x2c0));
  std::operator<<(poVar3,".dat");
  poVar3 = std::operator<<((ostream *)local_2f8,in_RDI);
  poVar3 = std::operator<<(poVar3,"/particle_");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x1b8));
  poVar3 = std::operator<<(poVar3,"_Cmnk_eta13");
  poVar3 = std::operator<<(poVar3,"_pT_");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x2b8));
  poVar3 = std::operator<<(poVar3,"_");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x2c0));
  std::operator<<(poVar3,".dat");
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_508,pcVar4,_S_out);
  std::__cxx11::string::~string(local_528);
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_728,pcVar4,_S_out);
  std::__cxx11::string::~string(local_748);
  if (*(int *)(in_RDI + 0x238) == 0) {
    poVar3 = std::operator<<(local_508,"# eta12  C_nmk  C_nmk_err ");
    poVar3 = std::operator<<(poVar3,"(000, 112, 123, 224, 235, 134, 246, 336, 347)");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(local_728,"# eta13  C_nmk  C_nmk_err ");
    poVar3 = std::operator<<(poVar3,"(000, 112, 123, 224, 235, 134, 246, 336, 347)");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar3 = std::operator<<(local_508,"# y12  C_nmk  C_nmk_err ");
    poVar3 = std::operator<<(poVar3,"(000, 112, 123, 224, 235, 134, 246, 336, 347)");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(local_728,"# y13  C_nmk  C_nmk_err ");
    poVar3 = std::operator<<(poVar3,"(000, 112, 123, 224, 235, 134, 246, 336, 347)");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  for (local_74c = 0; local_74c < *(int *)(in_RDI + 0x254); local_74c = local_74c + 1) {
    local_758 = (double)local_74c * *(double *)(in_RDI + 0x268) + *(double *)(in_RDI + 600);
    pvVar5 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)(in_RDI + 0x570),0);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_74c);
    local_760 = *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
    pvVar5 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)(in_RDI + 0x5a0),0);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_74c);
    local_768 = -local_760 * local_760 + *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
    local_770 = 0.0;
    if (0.0 < local_768) {
      local_770 = sqrt(local_768 / (double)*(int *)(in_RDI + 0x2f8));
    }
    poVar3 = (ostream *)std::ostream::operator<<(local_508,std::scientific);
    local_774 = (int)std::setw(0x12);
    poVar3 = std::operator<<(poVar3,(_Setw)local_774);
    local_778 = (int)std::setprecision(8);
    poVar3 = std::operator<<(poVar3,(_Setprecision)local_778);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_758);
    poVar3 = std::operator<<(poVar3,"  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_760);
    poVar3 = std::operator<<(poVar3,"  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_770);
    std::operator<<(poVar3,"  ");
    pvVar5 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)(in_RDI + 0x588),0);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_74c);
    local_780 = *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
    pvVar5 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)(in_RDI + 0x5b8),0);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_74c);
    local_788 = -local_780 * local_780 + *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
    local_770 = 0.0;
    if (0.0 < local_788) {
      local_770 = sqrt(local_788 / (double)*(int *)(in_RDI + 0x2f8));
    }
    poVar3 = (ostream *)std::ostream::operator<<(local_728,std::scientific);
    local_78c = (int)std::setw(0x12);
    poVar3 = std::operator<<(poVar3,(_Setw)local_78c);
    local_790 = (int)std::setprecision(8);
    poVar3 = std::operator<<(poVar3,(_Setprecision)local_790);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_758);
    poVar3 = std::operator<<(poVar3,"  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_780);
    poVar3 = std::operator<<(poVar3,"  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_770);
    std::operator<<(poVar3,"  ");
    for (local_794 = 1; local_794 < *(int *)(in_RDI + 0x538); local_794 = local_794 + 1) {
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x570),(long)local_794);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_74c);
      local_7a0 = *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x5a0),(long)local_794);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_74c);
      local_7a8 = -local_7a0 * local_7a0 + *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
      local_7a0 = local_7a0 / local_760;
      local_7b0 = 0.0;
      if (0.0 < local_7a8) {
        local_7b0 = sqrt(local_7a8 / (double)*(int *)(in_RDI + 0x2f8));
        local_7b0 = local_7b0 / local_760;
      }
      poVar3 = (ostream *)std::ostream::operator<<(local_508,std::scientific);
      local_7b4 = (int)std::setw(0x12);
      poVar3 = std::operator<<(poVar3,(_Setw)local_7b4);
      local_7b8 = (int)std::setprecision(8);
      poVar3 = std::operator<<(poVar3,(_Setprecision)local_7b8);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_7a0);
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_7b0);
      std::operator<<(poVar3,"  ");
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x588),(long)local_794);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_74c);
      local_7a0 = *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x5b8),(long)local_794);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_74c);
      local_7a8 = -local_7a0 * local_7a0 + *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
      local_7a0 = local_7a0 / local_780;
      local_7b0 = 0.0;
      if (0.0 < local_7a8) {
        local_7b0 = sqrt(local_7a8 / (double)*(int *)(in_RDI + 0x2f8));
        local_7b0 = local_7b0 / local_780;
      }
      local_7a8 = local_7a8 / local_760;
      poVar3 = (ostream *)std::ostream::operator<<(local_728,std::scientific);
      local_7bc = (int)std::setw(0x12);
      poVar3 = std::operator<<(poVar3,(_Setw)local_7bc);
      local_7c0 = (int)std::setprecision(8);
      poVar3 = std::operator<<(poVar3,(_Setprecision)local_7c0);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_7a0);
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_7b0);
      std::operator<<(poVar3,"  ");
    }
    std::ostream::operator<<(local_508,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(local_728,std::endl<char,std::char_traits<char>>);
  }
  std::ofstream::close();
  std::ofstream::close();
  if (*(int *)(in_RDI + 0x5d0) == 1) {
    std::__cxx11::ostringstream::ostringstream(local_938);
    std::__cxx11::ostringstream::ostringstream(local_ab0);
    std::__cxx11::ostringstream::ostringstream(local_c28);
    std::__cxx11::ostringstream::ostringstream(local_da0);
    poVar3 = std::operator<<((ostream *)local_938,in_RDI);
    poVar3 = std::operator<<(poVar3,"/particle_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x1b8));
    poVar3 = std::operator<<(poVar3,"_Cmnk_eta12_ss_pT_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x2b8));
    poVar3 = std::operator<<(poVar3,"_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x2c0));
    std::operator<<(poVar3,".dat");
    poVar3 = std::operator<<((ostream *)local_c28,in_RDI);
    poVar3 = std::operator<<(poVar3,"/particle_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x1b8));
    poVar3 = std::operator<<(poVar3,"_Cmnk_eta12_os_pT_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x2b8));
    poVar3 = std::operator<<(poVar3,"_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x2c0));
    std::operator<<(poVar3,".dat");
    poVar3 = std::operator<<((ostream *)local_ab0,in_RDI);
    poVar3 = std::operator<<(poVar3,"/particle_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x1b8));
    poVar3 = std::operator<<(poVar3,"_Cmnk_eta13_ss_pT_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x2b8));
    poVar3 = std::operator<<(poVar3,"_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x2c0));
    std::operator<<(poVar3,".dat");
    poVar3 = std::operator<<((ostream *)local_da0,in_RDI);
    poVar3 = std::operator<<(poVar3,"/particle_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x1b8));
    poVar3 = std::operator<<(poVar3,"_Cmnk_eta13_os_pT_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x2b8));
    poVar3 = std::operator<<(poVar3,"_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x2c0));
    std::operator<<(poVar3,".dat");
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(local_fa0,pcVar4,_S_out);
    std::__cxx11::string::~string(local_fc0);
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(local_11c0,pcVar4,_S_out);
    std::__cxx11::string::~string(local_11e0);
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(local_13e0,pcVar4,_S_out);
    std::__cxx11::string::~string(local_1400);
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(local_1600,pcVar4,_S_out);
    std::__cxx11::string::~string(local_1620);
    if (*(int *)(in_RDI + 0x238) == 0) {
      poVar3 = std::operator<<(local_fa0,"# eta12  C_nmk_ss  C_nmk_ss_err");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(local_11c0,"# eta12  C_nmk_os  C_nmk_os_err");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(local_13e0,"# eta13  C_nmk_ss  C_nmk_ss_err");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(local_1600,"# eta13  C_nmk_os  C_nmk_os_err");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar3 = std::operator<<(local_fa0,"# y12  C_nmk_ss  C_nmk_ss_err");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(local_11c0,"# y12  C_nmk_os  C_nmk_os_err");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(local_13e0,"# y13  C_nmk_ss  C_nmk_ss_err");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(local_1600,"# y13  C_nmk_os  C_nmk_os_err");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    for (local_1624 = 0; local_1624 < *(int *)(in_RDI + 0x254); local_1624 = local_1624 + 1) {
      dVar7 = (double)local_1624 * *(double *)(in_RDI + 0x268) + *(double *)(in_RDI + 600);
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x698),0);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_1624);
      dVar8 = *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x6f8),0);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_1624);
      dVar9 = -dVar8 * dVar8 + *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
      local_1648 = 0.0;
      if (0.0 < dVar9) {
        local_1648 = sqrt(dVar9 / (double)*(int *)(in_RDI + 0x2f8));
      }
      poVar3 = (ostream *)std::ostream::operator<<(local_fa0,std::scientific);
      _Var1 = std::setw(0x12);
      poVar3 = std::operator<<(poVar3,_Var1);
      _Var2 = std::setprecision(8);
      poVar3 = std::operator<<(poVar3,_Var2);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar7);
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar8);
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1648);
      std::operator<<(poVar3,"  ");
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x6b0),0);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_1624);
      dVar9 = *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x710),0);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_1624);
      dVar10 = -dVar9 * dVar9 + *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
      local_1668 = 0.0;
      if (0.0 < dVar10) {
        local_1668 = sqrt(dVar10 / (double)*(int *)(in_RDI + 0x2f8));
      }
      poVar3 = (ostream *)std::ostream::operator<<(local_11c0,std::scientific);
      _Var1 = std::setw(0x12);
      poVar3 = std::operator<<(poVar3,_Var1);
      _Var2 = std::setprecision(8);
      poVar3 = std::operator<<(poVar3,_Var2);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar7);
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar9);
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1668);
      std::operator<<(poVar3,"  ");
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x6c8),0);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_1624);
      dVar10 = *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x728),0);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_1624);
      dVar11 = -dVar10 * dVar10 + *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
      local_1688 = 0.0;
      if (0.0 < dVar11) {
        local_1688 = sqrt(dVar11 / (double)*(int *)(in_RDI + 0x2f8));
      }
      poVar3 = (ostream *)std::ostream::operator<<(local_13e0,std::scientific);
      _Var1 = std::setw(0x12);
      poVar3 = std::operator<<(poVar3,_Var1);
      _Var2 = std::setprecision(8);
      poVar3 = std::operator<<(poVar3,_Var2);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar7);
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar10);
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1688);
      std::operator<<(poVar3,"  ");
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x6e0),0);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_1624);
      dVar11 = *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x740),0);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_1624);
      dVar12 = -dVar11 * dVar11 + *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
      local_16a8 = 0.0;
      if (0.0 < dVar12) {
        local_16a8 = sqrt(dVar12 / (double)*(int *)(in_RDI + 0x2f8));
      }
      poVar3 = (ostream *)std::ostream::operator<<(local_1600,std::scientific);
      _Var1 = std::setw(0x12);
      poVar3 = std::operator<<(poVar3,_Var1);
      _Var2 = std::setprecision(8);
      poVar3 = std::operator<<(poVar3,_Var2);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar7);
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar11);
      poVar3 = std::operator<<(poVar3,"  ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_16a8);
      std::operator<<(poVar3,"  ");
      for (local_16b4 = 1; local_16b4 < *(int *)(in_RDI + 0x538); local_16b4 = local_16b4 + 1) {
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x698),(long)local_16b4);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_1624);
        dVar7 = *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x6f8),(long)local_16b4);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_1624);
        dVar12 = -dVar7 * dVar7 + *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
        local_16d0 = 0.0;
        if (0.0 < dVar12) {
          local_16d0 = sqrt(dVar12 / (double)*(int *)(in_RDI + 0x2f8));
          local_16d0 = local_16d0 / dVar8;
        }
        poVar3 = (ostream *)std::ostream::operator<<(local_fa0,std::scientific);
        _Var1 = std::setw(0x12);
        poVar3 = std::operator<<(poVar3,_Var1);
        _Var2 = std::setprecision(8);
        poVar3 = std::operator<<(poVar3,_Var2);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar7 / dVar8);
        poVar3 = std::operator<<(poVar3,"  ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_16d0);
        std::operator<<(poVar3,"  ");
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x6b0),(long)local_16b4);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_1624);
        dVar7 = *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x710),(long)local_16b4);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_1624);
        dVar12 = -dVar7 * dVar7 + *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
        local_16f0 = 0.0;
        if (0.0 < dVar12) {
          local_16f0 = sqrt(dVar12 / (double)*(int *)(in_RDI + 0x2f8));
          local_16f0 = local_16f0 / dVar9;
        }
        poVar3 = (ostream *)std::ostream::operator<<(local_11c0,std::scientific);
        _Var1 = std::setw(0x12);
        poVar3 = std::operator<<(poVar3,_Var1);
        _Var2 = std::setprecision(8);
        poVar3 = std::operator<<(poVar3,_Var2);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar7 / dVar9);
        poVar3 = std::operator<<(poVar3,"  ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_16f0);
        std::operator<<(poVar3,"  ");
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x6c8),(long)local_16b4);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_1624);
        dVar7 = *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x728),(long)local_16b4);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_1624);
        dVar12 = -dVar7 * dVar7 + *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
        local_16d0 = 0.0;
        if (0.0 < dVar12) {
          local_16d0 = sqrt(dVar12 / (double)*(int *)(in_RDI + 0x2f8));
          local_16d0 = local_16d0 / dVar10;
        }
        poVar3 = (ostream *)std::ostream::operator<<(local_13e0,std::scientific);
        _Var1 = std::setw(0x12);
        poVar3 = std::operator<<(poVar3,_Var1);
        _Var2 = std::setprecision(8);
        poVar3 = std::operator<<(poVar3,_Var2);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar7 / dVar10);
        poVar3 = std::operator<<(poVar3,"  ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_16d0);
        std::operator<<(poVar3,"  ");
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x6e0),(long)local_16b4);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_1624);
        dVar7 = *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
        pvVar5 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               *)(in_RDI + 0x740),(long)local_16b4);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_1624);
        dVar12 = -dVar7 * dVar7 + *pvVar6 / (double)*(int *)(in_RDI + 0x2f8);
        local_16f0 = 0.0;
        if (0.0 < dVar12) {
          local_16f0 = sqrt(dVar12 / (double)*(int *)(in_RDI + 0x2f8));
          local_16f0 = local_16f0 / dVar11;
        }
        poVar3 = (ostream *)std::ostream::operator<<(local_1600,std::scientific);
        _Var1 = std::setw(0x12);
        poVar3 = std::operator<<(poVar3,_Var1);
        _Var2 = std::setprecision(8);
        poVar3 = std::operator<<(poVar3,_Var2);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar7 / dVar11);
        poVar3 = std::operator<<(poVar3,"  ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_16f0);
        std::operator<<(poVar3,"  ");
      }
      std::ostream::operator<<(local_fa0,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(local_11c0,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(local_13e0,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(local_1600,std::endl<char,std::char_traits<char>>);
    }
    std::ofstream::close();
    std::ofstream::close();
    std::ofstream::close();
    std::ofstream::close();
    std::ofstream::~ofstream(local_1600);
    std::ofstream::~ofstream(local_13e0);
    std::ofstream::~ofstream(local_11c0);
    std::ofstream::~ofstream(local_fa0);
    std::__cxx11::ostringstream::~ostringstream(local_da0);
    std::__cxx11::ostringstream::~ostringstream(local_c28);
    std::__cxx11::ostringstream::~ostringstream(local_ab0);
    std::__cxx11::ostringstream::~ostringstream(local_938);
  }
  std::ofstream::~ofstream(local_728);
  std::ofstream::~ofstream(local_508);
  std::__cxx11::ostringstream::~ostringstream(local_2f8);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void singleParticleSpectra::output_three_particle_correlation_rap() {
    ostringstream filename1, filename2;
    filename1 << path_ << "/particle_" << particle_monval << "_Cmnk_eta12"
              << "_pT_" << vn_rapidity_dis_pT_min << "_"
              << vn_rapidity_dis_pT_max << ".dat";
    filename2 << path_ << "/particle_" << particle_monval << "_Cmnk_eta13"
              << "_pT_" << vn_rapidity_dis_pT_min << "_"
              << vn_rapidity_dis_pT_max << ".dat";
    ofstream output1(filename1.str().c_str());
    ofstream output2(filename2.str().c_str());
    if (rap_type == 0) {
        output1 << "# eta12  C_nmk  C_nmk_err "
                << "(000, 112, 123, 224, 235, 134, 246, 336, 347)" << endl;
        output2 << "# eta13  C_nmk  C_nmk_err "
                << "(000, 112, 123, 224, 235, 134, 246, 336, 347)" << endl;
    } else {
        output1 << "# y12  C_nmk  C_nmk_err "
                << "(000, 112, 123, 224, 235, 134, 246, 336, 347)" << endl;
        output2 << "# y13  C_nmk  C_nmk_err "
                << "(000, 112, 123, 224, 235, 134, 246, 336, 347)" << endl;
    }

    for (int j = 0; j < N_rap; j++) {
        double eta_local = rapidity_dis_min + j * drap;
        double num_pair = C_nmk_eta12[0][j] / total_number_of_events;
        double num_pair_stdsq =
            (C_nmk_eta12_err[0][j] / total_number_of_events
             - num_pair * num_pair);
        double num_pair_err = 0.0;
        if (num_pair_stdsq > 0) {
            num_pair_err = sqrt(num_pair_stdsq / total_number_of_events);
        }
        output1 << scientific << setw(18) << setprecision(8) << eta_local
                << "  " << num_pair << "  " << num_pair_err << "  ";
        double num_pair_2 = C_nmk_eta13[0][j] / total_number_of_events;
        double num_pair_2_stdsq =
            (C_nmk_eta13_err[0][j] / total_number_of_events
             - num_pair_2 * num_pair_2);
        num_pair_err = 0.0;
        if (num_pair_2_stdsq > 0) {
            num_pair_err = sqrt(num_pair_2_stdsq / total_number_of_events);
        }
        output2 << scientific << setw(18) << setprecision(8) << eta_local
                << "  " << num_pair_2 << "  " << num_pair_err << "  ";
        for (int i = 1; i < num_corr; i++) {
            double Cnmk_avg = C_nmk_eta12[i][j] / total_number_of_events;
            double Cnmk_stdsq =
                (C_nmk_eta12_err[i][j] / total_number_of_events
                 - Cnmk_avg * Cnmk_avg);
            Cnmk_avg = Cnmk_avg / num_pair;
            double Cnmk_err = 0.0;
            if (Cnmk_stdsq > 0) {
                Cnmk_err = sqrt(Cnmk_stdsq / total_number_of_events);
                Cnmk_err = Cnmk_err / num_pair;
            }
            output1 << scientific << setw(18) << setprecision(8) << Cnmk_avg
                    << "  " << Cnmk_err << "  ";
            Cnmk_avg = C_nmk_eta13[i][j] / total_number_of_events;
            Cnmk_stdsq =
                (C_nmk_eta13_err[i][j] / total_number_of_events
                 - Cnmk_avg * Cnmk_avg);
            Cnmk_avg = Cnmk_avg / num_pair_2;
            Cnmk_err = 0.0;
            if (Cnmk_stdsq > 0) {
                Cnmk_err = sqrt(Cnmk_stdsq / total_number_of_events);
                Cnmk_err = Cnmk_err / num_pair_2;
            }
            Cnmk_stdsq = Cnmk_stdsq / num_pair;
            output2 << scientific << setw(18) << setprecision(8) << Cnmk_avg
                    << "  " << Cnmk_err << "  ";
        }
        output1 << endl;
        output2 << endl;
    }
    output1.close();
    output2.close();
    if (flag_charge_dependence == 1) {
        ostringstream filename_ss1, filename_ss2;
        ostringstream filename_os1, filename_os2;
        filename_ss1 << path_ << "/particle_" << particle_monval
                     << "_Cmnk_eta12_ss_pT_" << vn_rapidity_dis_pT_min << "_"
                     << vn_rapidity_dis_pT_max << ".dat";
        filename_os1 << path_ << "/particle_" << particle_monval
                     << "_Cmnk_eta12_os_pT_" << vn_rapidity_dis_pT_min << "_"
                     << vn_rapidity_dis_pT_max << ".dat";
        filename_ss2 << path_ << "/particle_" << particle_monval
                     << "_Cmnk_eta13_ss_pT_" << vn_rapidity_dis_pT_min << "_"
                     << vn_rapidity_dis_pT_max << ".dat";
        filename_os2 << path_ << "/particle_" << particle_monval
                     << "_Cmnk_eta13_os_pT_" << vn_rapidity_dis_pT_min << "_"
                     << vn_rapidity_dis_pT_max << ".dat";
        ofstream output_ss1(filename_ss1.str().c_str());
        ofstream output_os1(filename_os1.str().c_str());
        ofstream output_ss2(filename_ss2.str().c_str());
        ofstream output_os2(filename_os2.str().c_str());
        if (rap_type == 0) {
            output_ss1 << "# eta12  C_nmk_ss  C_nmk_ss_err" << endl;
            output_os1 << "# eta12  C_nmk_os  C_nmk_os_err" << endl;
            output_ss2 << "# eta13  C_nmk_ss  C_nmk_ss_err" << endl;
            output_os2 << "# eta13  C_nmk_os  C_nmk_os_err" << endl;
        } else {
            output_ss1 << "# y12  C_nmk_ss  C_nmk_ss_err" << endl;
            output_os1 << "# y12  C_nmk_os  C_nmk_os_err" << endl;
            output_ss2 << "# y13  C_nmk_ss  C_nmk_ss_err" << endl;
            output_os2 << "# y13  C_nmk_os  C_nmk_os_err" << endl;
        }

        for (int j = 0; j < N_rap; j++) {
            double eta_local = rapidity_dis_min + j * drap;
            double num_pair_ss = C_nmk_eta12_ss[0][j] / total_number_of_events;
            double num_pair_ss_stdsq =
                (C_nmk_eta12_ss_err[0][j] / total_number_of_events
                 - num_pair_ss * num_pair_ss);
            double num_pair_ss_err = 0.0;
            if (num_pair_ss_stdsq > 0) {
                num_pair_ss_err =
                    (sqrt(num_pair_ss_stdsq / total_number_of_events));
            }
            output_ss1 << scientific << setw(18) << setprecision(8) << eta_local
                       << "  " << num_pair_ss << "  " << num_pair_ss_err
                       << "  ";
            double num_pair_os = C_nmk_eta12_os[0][j] / total_number_of_events;
            double num_pair_os_stdsq =
                (C_nmk_eta12_os_err[0][j] / total_number_of_events
                 - num_pair_os * num_pair_os);
            double num_pair_os_err = 0.0;
            if (num_pair_os_stdsq > 0) {
                num_pair_os_err =
                    (sqrt(num_pair_os_stdsq / total_number_of_events));
            }
            output_os1 << scientific << setw(18) << setprecision(8) << eta_local
                       << "  " << num_pair_os << "  " << num_pair_os_err
                       << "  ";
            double num_pair_ss2 = C_nmk_eta13_ss[0][j] / total_number_of_events;
            double num_pair_ss2_stdsq =
                (C_nmk_eta13_ss_err[0][j] / total_number_of_events
                 - num_pair_ss2 * num_pair_ss2);
            double num_pair_ss2_err = 0.0;
            if (num_pair_ss2_stdsq > 0) {
                num_pair_ss2_err =
                    (sqrt(num_pair_ss2_stdsq / total_number_of_events));
            }
            output_ss2 << scientific << setw(18) << setprecision(8) << eta_local
                       << "  " << num_pair_ss2 << "  " << num_pair_ss2_err
                       << "  ";
            double num_pair_os2 = C_nmk_eta13_os[0][j] / total_number_of_events;
            double num_pair_os2_stdsq =
                (C_nmk_eta13_os_err[0][j] / total_number_of_events
                 - num_pair_os2 * num_pair_os2);
            double num_pair_os2_err = 0.0;
            if (num_pair_os2_stdsq > 0) {
                num_pair_os2_err =
                    (sqrt(num_pair_os2_stdsq / total_number_of_events));
            }
            output_os2 << scientific << setw(18) << setprecision(8) << eta_local
                       << "  " << num_pair_os2 << "  " << num_pair_os2_err
                       << "  ";
            for (int i = 1; i < num_corr; i++) {
                double Cnmk_ss_avg =
                    (C_nmk_eta12_ss[i][j] / total_number_of_events);
                double Cnmk_ss_stdsq =
                    (C_nmk_eta12_ss_err[i][j] / total_number_of_events
                     - Cnmk_ss_avg * Cnmk_ss_avg);
                Cnmk_ss_avg = Cnmk_ss_avg / num_pair_ss;
                double Cnmk_ss_err = 0.0;
                if (Cnmk_ss_stdsq > 0) {
                    Cnmk_ss_err = sqrt(Cnmk_ss_stdsq / total_number_of_events);
                    Cnmk_ss_err = Cnmk_ss_err / num_pair_ss;
                }
                output_ss1 << scientific << setw(18) << setprecision(8)
                           << Cnmk_ss_avg << "  " << Cnmk_ss_err << "  ";
                double Cnmk_os_avg =
                    (C_nmk_eta12_os[i][j] / total_number_of_events);
                double Cnmk_os_stdsq =
                    (C_nmk_eta12_os_err[i][j] / total_number_of_events
                     - Cnmk_os_avg * Cnmk_os_avg);
                Cnmk_os_avg = Cnmk_os_avg / num_pair_os;
                double Cnmk_os_err = 0.0;
                if (Cnmk_os_stdsq > 0) {
                    Cnmk_os_err = sqrt(Cnmk_os_stdsq / total_number_of_events);
                    Cnmk_os_err = Cnmk_os_err / num_pair_os;
                }
                output_os1 << scientific << setw(18) << setprecision(8)
                           << Cnmk_os_avg << "  " << Cnmk_os_err << "  ";
                Cnmk_ss_avg = (C_nmk_eta13_ss[i][j] / total_number_of_events);
                Cnmk_ss_stdsq =
                    (C_nmk_eta13_ss_err[i][j] / total_number_of_events
                     - Cnmk_ss_avg * Cnmk_ss_avg);
                Cnmk_ss_avg = Cnmk_ss_avg / num_pair_ss2;
                Cnmk_ss_err = 0.0;
                if (Cnmk_ss_stdsq > 0) {
                    Cnmk_ss_err = sqrt(Cnmk_ss_stdsq / total_number_of_events);
                    Cnmk_ss_err = Cnmk_ss_err / num_pair_ss2;
                }
                output_ss2 << scientific << setw(18) << setprecision(8)
                           << Cnmk_ss_avg << "  " << Cnmk_ss_err << "  ";
                Cnmk_os_avg = (C_nmk_eta13_os[i][j] / total_number_of_events);
                Cnmk_os_stdsq =
                    (C_nmk_eta13_os_err[i][j] / total_number_of_events
                     - Cnmk_os_avg * Cnmk_os_avg);
                Cnmk_os_avg = Cnmk_os_avg / num_pair_os2;
                Cnmk_os_err = 0.0;
                if (Cnmk_os_stdsq > 0) {
                    Cnmk_os_err = sqrt(Cnmk_os_stdsq / total_number_of_events);
                    Cnmk_os_err = Cnmk_os_err / num_pair_os2;
                }
                output_os2 << scientific << setw(18) << setprecision(8)
                           << Cnmk_os_avg << "  " << Cnmk_os_err << "  ";
            }
            output_ss1 << endl;
            output_os1 << endl;
            output_ss2 << endl;
            output_os2 << endl;
        }
        output_ss1.close();
        output_os1.close();
        output_ss2.close();
        output_os2.close();
    }
}